

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-utils.c
# Opt level: O0

int coda_path_find_file(char *searchpath,char *filename,char **location)

{
  int iVar1;
  size_t sVar2;
  char *__ptr;
  char *pcVar3;
  bool bVar4;
  char *new_filepath;
  char *pcStack_e8;
  int path_component_length;
  char *p;
  stat sb;
  int filename_length;
  int filepath_length;
  char *filepath;
  char *path_component;
  char *path;
  char path_separator_char;
  char **location_local;
  char *filename_local;
  char *searchpath_local;
  
  _filename_length = (char *)0x0;
  sb.__glibc_reserved[2]._4_4_ = 0;
  sVar2 = strlen(filename);
  sb.__glibc_reserved[2]._0_4_ = (int)sVar2;
  if ((searchpath == (char *)0x0) || (*searchpath == '\0')) {
    *location = (char *)0x0;
    searchpath_local._4_4_ = 0;
  }
  else {
    __ptr = strdup(searchpath);
    filepath = __ptr;
    if (__ptr == (char *)0x0) {
      coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-utils.c"
                     ,0x187);
      searchpath_local._4_4_ = -1;
    }
    else {
      while (*filepath != '\0') {
        pcStack_e8 = filepath;
        while( true ) {
          bVar4 = false;
          if (*pcStack_e8 != '\0') {
            bVar4 = *pcStack_e8 != ':';
          }
          if (!bVar4) break;
          pcStack_e8 = pcStack_e8 + 1;
        }
        if (*pcStack_e8 != '\0') {
          *pcStack_e8 = '\0';
          pcStack_e8 = pcStack_e8 + 1;
        }
        sVar2 = strlen(filepath);
        iVar1 = (int)sVar2;
        if (sb.__glibc_reserved[2]._4_4_ < iVar1 + (int)sb.__glibc_reserved[2] + 1) {
          pcVar3 = (char *)realloc(_filename_length,(long)(iVar1 + (int)sb.__glibc_reserved[2] + 2))
          ;
          if (pcVar3 == (char *)0x0) {
            coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                           "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-utils.c"
                           ,0x1a5);
            if (_filename_length != (char *)0x0) {
              free(_filename_length);
            }
            return -1;
          }
          sb.__glibc_reserved[2]._4_4_ = iVar1 + (int)sb.__glibc_reserved[2] + 1;
          _filename_length = pcVar3;
        }
        sprintf(_filename_length,"%s/%s",filepath,filename);
        iVar1 = stat(_filename_length,(stat *)&p);
        if ((iVar1 == 0) && (((uint)sb.st_nlink & 0x8000) != 0)) {
          *location = _filename_length;
          free(__ptr);
          return 0;
        }
        filepath = pcStack_e8;
      }
      if (_filename_length != (char *)0x0) {
        free(_filename_length);
      }
      free(__ptr);
      *location = (char *)0x0;
      searchpath_local._4_4_ = 0;
    }
  }
  return searchpath_local._4_4_;
}

Assistant:

int coda_path_find_file(const char *searchpath, const char *filename, char **location)
{
#ifdef WIN32
    const char path_separator_char = ';';
#else
    const char path_separator_char = ':';
#endif
    char *path;
    char *path_component;
    char *filepath = NULL;
    int filepath_length = 0;
    int filename_length = (int)strlen(filename);

    if (searchpath == NULL || searchpath[0] == '\0')
    {
        *location = NULL;
        return 0;
    }

    path = strdup(searchpath);
    if (path == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate string) (%s:%u)", __FILE__,
                       __LINE__);
        return -1;
    }
    path_component = path;
    while (*path_component != '\0')
    {
        struct stat sb;
        char *p;
        int path_component_length;

        p = path_component;
        while (*p != '\0' && *p != path_separator_char)
        {
            p++;
        }
        if (*p != '\0')
        {
            *p = '\0';
            p++;
        }

        path_component_length = (int)strlen(path_component);
        if (filepath_length < path_component_length + filename_length + 1)
        {
            char *new_filepath;

            new_filepath = realloc(filepath, path_component_length + filename_length + 2);
            if (new_filepath == NULL)
            {
                coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate string) (%s:%u)", __FILE__,
                               __LINE__);
                if (filepath != NULL)
                {
                    free(filepath);
                }
                return -1;
            }
            filepath = new_filepath;
            filepath_length = path_component_length + filename_length + 1;
        }
        sprintf(filepath, "%s/%s", path_component, filename);

        if (stat(filepath, &sb) == 0)
        {
            if (sb.st_mode & S_IFREG)
            {
                /* we found the file */
                *location = filepath;
                free(path);
                return 0;
            }
        }

        path_component = p;
    }

    if (filepath != NULL)
    {
        free(filepath);
    }
    free(path);

    /* the file was not found */
    *location = NULL;
    return 0;
}